

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::HeapprofdConfig::ParseFromArray(HeapprofdConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  _Head_base<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_false> _Var3;
  iterator iVar4;
  bool bVar5;
  short sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  uint32_t uVar11;
  ulong uVar12;
  pointer pbVar13;
  unsigned_long *puVar14;
  uint8_t cur_byte_2;
  ulong uVar15;
  uint8_t cur_byte_3;
  ulong *puVar16;
  uint8_t cur_byte;
  ulong uVar17;
  uint8_t cur_byte_1;
  ulong *puVar18;
  Field local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = &this->process_cmdline_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->process_cmdline_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_40 = &this->target_installed_by_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_40,(this->target_installed_by_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_48 = &this->heaps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_48,(this->heaps_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_50 = &this->exclude_heaps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_50,(this->exclude_heaps_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->heap_sampling_intervals_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->heap_sampling_intervals_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->heap_sampling_intervals_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_60 = &this->pid_;
  local_68 = &this->heap_sampling_intervals_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->skip_symbol_prefix_,
                    (this->skip_symbol_prefix_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->unknown_fields_)._M_string_length = 0;
  local_58 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar10 = (ulong *)(size + (long)raw);
  do {
    if (puVar10 <= raw) goto switchD_00232ac2_caseD_3;
    bVar1 = (byte)*raw;
    uVar9 = (ulong)bVar1;
    puVar16 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar9 = (ulong)(bVar1 & 0x7f);
      lVar8 = 7;
      do {
        if ((puVar10 <= puVar16) || (0x38 < lVar8 - 7U)) goto switchD_00232ac2_caseD_3;
        uVar7 = *puVar16;
        puVar16 = (ulong *)((long)puVar16 + 1);
        uVar9 = uVar9 | (ulong)((byte)uVar7 & 0x7f) << ((byte)lVar8 & 0x3f);
        lVar8 = lVar8 + 7;
      } while ((char)(byte)uVar7 < '\0');
    }
    uVar7 = uVar9 >> 3;
    if (((uint)uVar7 == 0) || (puVar10 <= puVar16)) goto switchD_00232ac2_caseD_3;
    switch((uint)uVar9 & 7) {
    case 0:
      uVar15 = 0;
      uVar12 = 0;
      while( true ) {
        puVar18 = (ulong *)((long)puVar16 + 1);
        uVar15 = (ulong)((byte)*puVar16 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar15;
        if (-1 < (char)(byte)*puVar16) break;
        if ((puVar10 <= puVar18) ||
           (bVar5 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar16 = puVar18, bVar5))
        goto switchD_00232ac2_caseD_3;
      }
      uVar12 = uVar15 & 0xffffffff00000000;
      break;
    case 1:
      puVar18 = puVar16 + 1;
      if (puVar10 < puVar18) goto switchD_00232ac2_caseD_3;
      uVar15 = *puVar16;
      uVar12 = uVar15 & 0xffffffff00000000;
      break;
    case 2:
      puVar16 = (ulong *)((long)puVar16 + 1);
      uVar17 = 0;
      uVar15 = 0;
      puVar18 = puVar16;
      while (uVar17 = (ulong)(*(byte *)((long)puVar18 + -1) & 0x7f) << ((byte)uVar15 & 0x3f) |
                      uVar17, (char)*(byte *)((long)puVar18 + -1) < '\0') {
        if (puVar10 <= puVar18) goto switchD_00232ac2_caseD_3;
        puVar18 = (ulong *)((long)puVar18 + 1);
        puVar16 = (ulong *)((long)puVar16 + 1);
        bVar5 = 0x38 < uVar15;
        uVar15 = uVar15 + 7;
        if (bVar5) goto switchD_00232ac2_caseD_3;
      }
      if (uVar17 <= (ulong)((long)puVar10 - (long)puVar16)) {
        uVar12 = (ulong)puVar16 & 0xffffffff00000000;
        puVar18 = (ulong *)((long)puVar18 + uVar17);
        uVar15 = (ulong)puVar16 & 0xffffffff;
        goto LAB_00232b9e;
      }
    default:
      goto switchD_00232ac2_caseD_3;
    case 5:
      puVar18 = (ulong *)((long)puVar16 + 4);
      if (puVar10 < puVar18) goto switchD_00232ac2_caseD_3;
      uVar15 = (ulong)(uint)*puVar16;
      uVar12 = 0;
    }
    uVar17 = 0;
LAB_00232b9e:
    raw = puVar18;
  } while ((0xffff < (uint)uVar7) || (0xfffffff < uVar17));
  local_78.int_value_ = uVar12 | uVar15 & 0xffffffff;
  uVar15 = uVar7 << 0x20 | uVar17;
  uVar9 = uVar15 | (ulong)((uint)uVar9 & 7) << 0x30;
  local_78.size_ = (uint32_t)uVar17;
  local_78.type_ = (uint8_t)(uVar9 >> 0x30);
  local_78.id_ = (uint16_t)(uVar15 >> 0x20);
  sVar6 = (short)uVar7;
  do {
    if (sVar6 == 0) {
switchD_00232ac2_caseD_3:
      return puVar10 == (ulong *)raw;
    }
    if ((ushort)uVar7 < 0x1c) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar7 & 0x3f);
    }
    uVar11 = (uint32_t)local_78.int_value_;
    switch((uint)uVar7 & 0xffff) {
    case 1:
      this->sampling_interval_bytes_ = local_78.int_value_;
      break;
    case 2:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_38);
      pbVar13 = (this->process_cmdline_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00232e5b;
    default:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_78,local_58);
      break;
    case 4:
      iVar4._M_current =
           (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                  (local_60,iVar4);
        puVar14 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *iVar4._M_current = 0;
        puVar14 = iVar4._M_current + 1;
        (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar14;
      }
      goto LAB_00232f07;
    case 5:
      this->all_ = local_78.int_value_ != 0;
      break;
    case 6:
      _Var3._M_head_impl =
           (this->continuous_dump_config_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
           .
           super__Head_base<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_false>
           ._M_head_impl;
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_CppMessageObj + 0x20))
                (_Var3._M_head_impl,local_78.int_value_,uVar9 & 0xffffffff);
      break;
    case 7:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->skip_symbol_prefix_);
      pbVar13 = (this->skip_symbol_prefix_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00232e5b;
    case 8:
      this->shmem_size_bytes_ = local_78.int_value_;
      break;
    case 9:
      this->block_client_ = local_78.int_value_ != 0;
      break;
    case 10:
      this->no_startup_ = local_78.int_value_ != 0;
      break;
    case 0xb:
      this->no_running_ = local_78.int_value_ != 0;
      break;
    case 0xd:
      this->dump_at_max_ = local_78.int_value_ != 0;
      break;
    case 0xe:
      this->block_client_timeout_us_ = uVar11;
      break;
    case 0xf:
      this->min_anonymous_memory_kb_ = uVar11;
      break;
    case 0x10:
      this->max_heapprofd_memory_kb_ = uVar11;
      break;
    case 0x11:
      this->max_heapprofd_cpu_secs_ = local_78.int_value_;
      break;
    case 0x12:
      this->disable_fork_teardown_ = local_78.int_value_ != 0;
      break;
    case 0x13:
      this->disable_vfork_detection_ = local_78.int_value_ != 0;
      break;
    case 0x14:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_48);
      pbVar13 = (this->heaps_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00232e5b;
    case 0x15:
      this->all_heaps_ = local_78.int_value_ != 0;
      break;
    case 0x16:
      iVar4._M_current =
           (this->heap_sampling_intervals_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->heap_sampling_intervals_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                  (local_68,iVar4);
        puVar14 = (this->heap_sampling_intervals_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        *iVar4._M_current = 0;
        puVar14 = iVar4._M_current + 1;
        (this->heap_sampling_intervals_).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar14;
      }
LAB_00232f07:
      puVar14[-1] = local_78.int_value_;
      break;
    case 0x17:
      this->stream_allocations_ = local_78.int_value_ != 0;
      break;
    case 0x18:
      this->adaptive_sampling_shmem_threshold_ = local_78.int_value_;
      break;
    case 0x19:
      this->adaptive_sampling_max_sampling_interval_bytes_ = local_78.int_value_;
      break;
    case 0x1a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_40);
      pbVar13 = (this->target_installed_by_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00232e5b;
    case 0x1b:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_50);
      pbVar13 = (this->exclude_heaps_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
LAB_00232e5b:
      protozero::Field::get(&local_78,pbVar13 + -1);
    }
    do {
      if (puVar10 <= raw) goto switchD_00232ac2_caseD_3;
      bVar1 = (byte)*raw;
      uVar9 = (ulong)(uint)bVar1;
      puVar16 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar9 = (ulong)(bVar1 & 0x7f);
        lVar8 = 7;
        do {
          if ((puVar10 <= puVar16) || (0x38 < lVar8 - 7U)) goto switchD_00232ac2_caseD_3;
          uVar7 = *puVar16;
          puVar16 = (ulong *)((long)puVar16 + 1);
          uVar9 = uVar9 | (ulong)((byte)uVar7 & 0x7f) << ((byte)lVar8 & 0x3f);
          lVar8 = lVar8 + 7;
        } while ((char)(byte)uVar7 < '\0');
      }
      uVar7 = uVar9 >> 3;
      if (((uint)uVar7 == 0) || (puVar10 <= puVar16)) goto switchD_00232ac2_caseD_3;
      switch((uint)uVar9 & 7) {
      case 0:
        uVar15 = 0;
        uVar12 = 0;
        while( true ) {
          puVar18 = (ulong *)((long)puVar16 + 1);
          uVar15 = (ulong)((byte)*puVar16 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar15;
          if (-1 < (char)(byte)*puVar16) break;
          if ((puVar10 <= puVar18) ||
             (bVar5 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar16 = puVar18, bVar5))
          goto switchD_00232ac2_caseD_3;
        }
        uVar12 = uVar15 & 0xffffffff00000000;
        break;
      case 1:
        puVar18 = puVar16 + 1;
        if (puVar10 < puVar18) goto switchD_00232ac2_caseD_3;
        uVar15 = *puVar16;
        uVar12 = uVar15 & 0xffffffff00000000;
        break;
      case 2:
        puVar16 = (ulong *)((long)puVar16 + 1);
        uVar17 = 0;
        uVar15 = 0;
        puVar18 = puVar16;
        while (uVar17 = (ulong)(*(byte *)((long)puVar18 + -1) & 0x7f) << ((byte)uVar15 & 0x3f) |
                        uVar17, (char)*(byte *)((long)puVar18 + -1) < '\0') {
          if (puVar10 <= puVar18) goto switchD_00232ac2_caseD_3;
          puVar18 = (ulong *)((long)puVar18 + 1);
          puVar16 = (ulong *)((long)puVar16 + 1);
          bVar5 = 0x38 < uVar15;
          uVar15 = uVar15 + 7;
          if (bVar5) goto switchD_00232ac2_caseD_3;
        }
        if (uVar17 <= (ulong)((long)puVar10 - (long)puVar16)) {
          uVar12 = (ulong)puVar16 & 0xffffffff00000000;
          puVar18 = (ulong *)((long)puVar18 + uVar17);
          uVar15 = (ulong)puVar16 & 0xffffffff;
          goto LAB_00233099;
        }
      default:
        goto switchD_00232ac2_caseD_3;
      case 5:
        puVar18 = (ulong *)((long)puVar16 + 4);
        if (puVar10 < puVar18) goto switchD_00232ac2_caseD_3;
        uVar15 = (ulong)(uint)*puVar16;
        uVar12 = 0;
      }
      uVar17 = 0;
LAB_00233099:
      raw = puVar18;
    } while ((0xffff < (uint)uVar7) || (0xfffffff < uVar17));
    local_78.int_value_ = uVar12 | uVar15 & 0xffffffff;
    uVar15 = uVar7 << 0x20 | uVar17;
    uVar9 = uVar15 | (uVar9 & 7) << 0x30;
    local_78.size_ = (uint32_t)uVar17;
    local_78.type_ = (uint8_t)(uVar9 >> 0x30);
    local_78.id_ = (uint16_t)(uVar15 >> 0x20);
    sVar6 = (short)uVar7;
  } while( true );
}

Assistant:

bool HeapprofdConfig::ParseFromArray(const void* raw, size_t size) {
  process_cmdline_.clear();
  pid_.clear();
  target_installed_by_.clear();
  heaps_.clear();
  exclude_heaps_.clear();
  heap_sampling_intervals_.clear();
  skip_symbol_prefix_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* sampling_interval_bytes */:
        field.get(&sampling_interval_bytes_);
        break;
      case 24 /* adaptive_sampling_shmem_threshold */:
        field.get(&adaptive_sampling_shmem_threshold_);
        break;
      case 25 /* adaptive_sampling_max_sampling_interval_bytes */:
        field.get(&adaptive_sampling_max_sampling_interval_bytes_);
        break;
      case 2 /* process_cmdline */:
        process_cmdline_.emplace_back();
        field.get(&process_cmdline_.back());
        break;
      case 4 /* pid */:
        pid_.emplace_back();
        field.get(&pid_.back());
        break;
      case 26 /* target_installed_by */:
        target_installed_by_.emplace_back();
        field.get(&target_installed_by_.back());
        break;
      case 20 /* heaps */:
        heaps_.emplace_back();
        field.get(&heaps_.back());
        break;
      case 27 /* exclude_heaps */:
        exclude_heaps_.emplace_back();
        field.get(&exclude_heaps_.back());
        break;
      case 23 /* stream_allocations */:
        field.get(&stream_allocations_);
        break;
      case 22 /* heap_sampling_intervals */:
        heap_sampling_intervals_.emplace_back();
        field.get(&heap_sampling_intervals_.back());
        break;
      case 21 /* all_heaps */:
        field.get(&all_heaps_);
        break;
      case 5 /* all */:
        field.get(&all_);
        break;
      case 15 /* min_anonymous_memory_kb */:
        field.get(&min_anonymous_memory_kb_);
        break;
      case 16 /* max_heapprofd_memory_kb */:
        field.get(&max_heapprofd_memory_kb_);
        break;
      case 17 /* max_heapprofd_cpu_secs */:
        field.get(&max_heapprofd_cpu_secs_);
        break;
      case 7 /* skip_symbol_prefix */:
        skip_symbol_prefix_.emplace_back();
        field.get(&skip_symbol_prefix_.back());
        break;
      case 6 /* continuous_dump_config */:
        (*continuous_dump_config_).ParseFromArray(field.data(), field.size());
        break;
      case 8 /* shmem_size_bytes */:
        field.get(&shmem_size_bytes_);
        break;
      case 9 /* block_client */:
        field.get(&block_client_);
        break;
      case 14 /* block_client_timeout_us */:
        field.get(&block_client_timeout_us_);
        break;
      case 10 /* no_startup */:
        field.get(&no_startup_);
        break;
      case 11 /* no_running */:
        field.get(&no_running_);
        break;
      case 13 /* dump_at_max */:
        field.get(&dump_at_max_);
        break;
      case 18 /* disable_fork_teardown */:
        field.get(&disable_fork_teardown_);
        break;
      case 19 /* disable_vfork_detection */:
        field.get(&disable_vfork_detection_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}